

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::MonitorTask::checkArguments
          (MonitorTask *this,ASTContext *context,Args *args,SourceRange range,Expression *iterOrThis
          )

{
  pointer ppEVar1;
  size_type sVar2;
  bool bVar3;
  Type *this_00;
  long lVar4;
  MonitorVisitor visitor;
  MonitorVisitor local_30;
  
  this_00 = builtins::DisplayTask::checkArguments
                      (&this->super_DisplayTask,context,args,range,iterOrThis);
  bVar3 = Type::isError(this_00);
  if (!bVar3) {
    ppEVar1 = args->data_;
    sVar2 = args->size_;
    local_30.context = context;
    for (lVar4 = 0; sVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
      Expression::visit<slang::ast::builtins::MonitorVisitor&>
                (*(Expression **)((long)ppEVar1 + lVar4),&local_30);
    }
  }
  return this_00;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* iterOrThis) const final {
        auto& result = DisplayTask::checkArguments(context, args, range, iterOrThis);
        if (result.isError())
            return result;

        // Additional restriction for monitor tasks: automatic variables cannot be referenced.
        MonitorVisitor visitor(context);
        for (auto arg : args)
            arg->visit(visitor);

        return result;
    }